

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# realdata_unit.c
# Opt level: O2

_Bool compare_negations(roaring_bitmap_t **rnorun,roaring_bitmap_t **rruns,size_t count)

{
  ulong uVar1;
  _Bool _Var2;
  ulong uVar3;
  char *__s;
  
  __s = "no-run negation incorrect";
  uVar1 = 0;
  do {
    uVar3 = uVar1;
    if (count == uVar3) goto LAB_001035bb;
    _Var2 = is_negation_correct(rnorun[uVar3]);
    if (!_Var2) goto LAB_001035b3;
    _Var2 = is_negation_correct(rruns[uVar3]);
    uVar1 = uVar3 + 1;
  } while (_Var2);
  __s = "runs negations incorrect";
LAB_001035b3:
  puts(__s);
LAB_001035bb:
  return count <= uVar3;
}

Assistant:

bool compare_negations(roaring_bitmap_t **rnorun, roaring_bitmap_t **rruns,
                       size_t count) {
    for (size_t i = 0; i < count; ++i) {
        if (!is_negation_correct(rnorun[i])) {
            printf("no-run negation incorrect\n");
            return false;
        }
        if (!is_negation_correct(rruns[i])) {
            printf("runs negations incorrect\n");
            return false;
        }
    }
    return true;
}